

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::integer_to_hex<unsigned_char,std::__cxx11::string>
          (uchar value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  char cVar1;
  string *s;
  type_conflict2 tVar2;
  char *pcVar3;
  undefined8 in_RSI;
  byte in_DIL;
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  assertion_error *this;
  bool local_172;
  bool local_171;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *local_120;
  char local_118 [255];
  char acStack_19 [9];
  undefined8 local_10;
  byte local_1;
  
  local_120 = local_118;
  local_10 = in_RSI;
  local_1 = in_DIL;
  if ((int)(uint)in_DIL < 0) {
    do {
      cVar1 = to_hex_character(-(local_1 % 0x10));
      pcVar3 = local_120 + 1;
      *local_120 = cVar1;
      local_1 = local_1 / 0x10;
      local_171 = local_1 != 0 && pcVar3 < acStack_19;
      local_120 = pcVar3;
    } while (local_171);
  }
  else {
    do {
      cVar1 = to_hex_character(local_1 % 0x10);
      pcVar3 = local_120 + 1;
      *local_120 = cVar1;
      local_1 = local_1 / 0x10;
      local_172 = local_1 != 0 && pcVar3 < acStack_19;
      local_120 = pcVar3;
    } while (local_172);
  }
  if (local_120 != acStack_19) {
    tVar2 = (long)local_120 - (long)local_118;
    while (local_120 = local_120 + -1, local_118 <= local_120) {
      std::__cxx11::string::push_back((char)local_10);
    }
    return tVar2;
  }
  s = (string *)__cxa_allocate_exception(0x10);
  this = (assertion_error *)&stack0xfffffffffffffeaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  assertion_error::assertion_error(this,s);
  __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    integer_to_hex(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = to_hex_character(0-(value % 16));
            }
            while ((value /= 16) && (p < last));
        }
        else
        {

            do
            {
                *p++ = to_hex_character(value % 16);
            }
            while ((value /= 16) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }